

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_47346::BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test::
TestBody(BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test *this)

{
  long *plVar1;
  raw_ostream *prVar2;
  long *plVar3;
  Child *EC;
  void *pvVar4;
  char *message;
  char *in_R9;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef mainFilename;
  StringRef str;
  BuildSystem system;
  string outputFile;
  AssertionResult gtest_ar;
  thread cancelThread;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> fs;
  AssertionResult gtest_ar_;
  BuildKey keyToBuild;
  MockBuildSystemDelegate delegate;
  Optional<llbuild::buildsystem::BuildValue> result;
  SmallString<256U> manifest;
  TmpDir tempDir;
  BuildSystem local_400;
  long *local_3f8;
  void *local_3f0;
  long local_3e8;
  long lStack_3e0;
  Message local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  long local_3c8;
  AssertHelper local_3c0;
  Child local_3b8;
  Child local_3b0 [2];
  AssertHelper local_3a0;
  __uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  local_398;
  uint local_38c;
  Child local_388;
  long local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  long *local_368 [2];
  long local_358 [2];
  Child local_348;
  long local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318 [2];
  ExecutionQueueDelegate local_2d8 [2];
  Child local_2c8;
  undefined8 local_2c0;
  anon_union_80_2_ecfed234_for_valueData local_2b8;
  char local_258;
  string local_250 [8];
  TmpDir local_140;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&local_140,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_(local_250,&local_140);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_250);
  local_3f8 = &local_3e8;
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_3e8 = *plVar3;
    lStack_3e0 = plVar1[3];
  }
  else {
    local_3e8 = *plVar3;
    local_3f8 = (long *)*plVar1;
  }
  local_3f0 = (void *)plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250[0]._M_dataplus._M_p != &local_250[0].field_2) {
    operator_delete(local_250[0]._M_dataplus._M_p,local_250[0].field_2._M_allocated_capacity + 1);
  }
  if (local_3f0 != (void *)0x0) {
    pvVar4 = (void *)0x0;
    do {
      if (*(char *)((long)local_3f8 + (long)pvVar4) == '\\') {
        *(undefined1 *)((long)local_3f8 + (long)pvVar4) = 0x2f;
      }
      pvVar4 = (void *)((long)pvVar4 + 1);
    } while (local_3f0 != pvVar4);
  }
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_348,&local_140);
  local_250[0]._M_string_length._0_4_ = 0;
  local_250[0]._M_string_length._4_4_ = 0x100;
  local_250[0]._M_dataplus._M_p = (pointer)&local_250[0].field_2;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)local_250,local_348.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_348.twine)->LHS)->_M_local_buf + local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.twine != local_338) {
    operator_delete(local_348.twine,local_338[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_348,"manifest.llbuild");
  message = "";
  llvm::Twine::Twine((Twine *)&local_2c8,"");
  llvm::Twine::Twine((Twine *)&local_388,"");
  llvm::Twine::Twine((Twine *)&local_3b8,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_250,(Twine *)&local_348,(Twine *)&local_2c8,
             (Twine *)&local_388,(Twine *)&local_3b8);
  local_2c8.twine = (Twine *)((ulong)(uint)local_2c8._4_4_ << 0x20);
  local_2c0 = std::_V2::system_category();
  Filename.Length._0_4_ = (undefined4)local_250[0]._M_string_length;
  Filename.Data = local_250[0]._M_dataplus._M_p;
  EC = &local_2c8;
  Filename.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_348,Filename,(error_code *)EC,F_Text);
  if (local_2c8.decUI == 0) {
    Str.Length = 0x8d;
    Str.Data = 
    "client:\n  name: mock\n\ncommands:\n  WAIT:\n    tool: shell\n    deps: \"/tmp/deps.info\"\n    deps-style: dependency-info\n    inputs: [\"<cleanup>\"]\n"
    ;
    llvm::raw_ostream::operator<<((raw_ostream *)&local_348,Str);
    Str_00.Length = 0xf;
    Str_00.Data = "    outputs: [\"";
    prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&local_348,Str_00);
    prVar2 = (raw_ostream *)llvm::raw_ostream::write(prVar2,(int)local_3f8,local_3f0,(size_t)EC);
    Str_01.Length = 3;
    Str_01.Data = "\"]\n";
    llvm::raw_ostream::operator<<(prVar2,Str_01);
    Str_02.Length = 0x22;
    Str_02.Data = "    description: \"WAIT\"\n    args:\n";
    llvm::raw_ostream::operator<<((raw_ostream *)&local_348,Str_02);
    Str_03.Length = 0xc;
    Str_03.Data = "      touch ";
    prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&local_348,Str_03);
    prVar2 = (raw_ostream *)llvm::raw_ostream::write(prVar2,(int)local_3f8,local_3f0,(size_t)EC);
    Str_04.Length = 1;
    Str_04.Data = "\n";
    llvm::raw_ostream::operator<<(prVar2,Str_04);
    Str_05.Length = 0x11;
    Str_05.Data = "      sleep 9999\n";
    llvm::raw_ostream::operator<<((raw_ostream *)&local_348,Str_05);
    llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_348);
    str.Length = 4;
    str.Data = "WAIT";
    llbuild::buildsystem::BuildKey::BuildKey((BuildKey *)&local_388,'C',str);
    llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&local_348,false);
    llbuild::basic::createLocalFileSystem();
    llbuild::buildsystem::BuildSystem::BuildSystem
              (&local_400,(BuildSystemDelegate *)&local_348,
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&local_398);
    if (local_398._M_t.
        super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
        .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
         )0x0) {
      (*(*(_func_int ***)
          local_398._M_t.
          super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
          .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl)[1])();
    }
    local_398._M_t.
    super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
    .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl =
         (tuple<llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>)
         (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
          )0x0;
    mainFilename.Length._0_4_ = (undefined4)local_250[0]._M_string_length;
    mainFilename.Data = local_250[0]._M_dataplus._M_p;
    mainFilename.Length._4_4_ = 0;
    local_3b8.character =
         llbuild::buildsystem::BuildSystem::loadDescription(&local_400,mainFilename);
    local_3b0[0].twine = (Twine *)0x0;
    if ((bool)local_3b8.character) {
      llbuild::basic::createLocalFileSystem();
      local_3c8 = 0;
      local_2c8.twine = (Twine *)operator_new(0x20);
      (local_2c8.stringRef)->Data = (char *)&PTR___State_00254fa8;
      *(AssertHelper **)
       &((local_2c8.smallString)->super_SmallVectorTemplateBase<char,_true>).
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = &local_3c0;
      *(long ***)&(local_2c8.twine)->LHSKind = &local_3f8;
      *(BuildSystem **)((long)&(local_2c8.stdString)->field_2 + 8) = &local_400;
      std::thread::_M_start_thread(&local_3c8,&local_2c8,0);
      if ((anon_union_80_2_ecfed234_for_valueData *)local_2c8.twine !=
          (anon_union_80_2_ecfed234_for_valueData *)0x0) {
        (*(code *)((FileInfo *)*local_2c8.decUL)->inode)();
      }
      local_368[0] = local_358;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_368,local_388.twine,(long)&(local_388.twine)->LHS + local_380);
      llbuild::buildsystem::BuildSystem::build
                ((Optional<llbuild::buildsystem::BuildValue> *)&local_2c8,&local_400,
                 (BuildKey *)local_368);
      if (local_368[0] != local_358) {
        operator_delete(local_368[0],local_358[0] + 1);
      }
      std::thread::join();
      llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_3b8,(MockBuildSystemDelegate *)&local_348);
      local_3a0.data_ =
           (AssertHelperData *)
           ((long)local_3b0[0].twine - CONCAT71(local_3b8._1_7_,local_3b8.character) >> 5);
      local_38c = 0;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&local_3d8,"delegate.getMessages().size()","0U",
                 (unsigned_long *)&local_3a0,&local_38c);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3b8);
      if (local_3d8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_3b8);
        if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = (local_3d0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x1c6,message);
        testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_3b8);
        testing::internal::AssertHelper::~AssertHelper(&local_3a0);
        if ((long *)CONCAT71(local_3b8._1_7_,local_3b8.character) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_3b8._1_7_,local_3b8.character) + 8))();
        }
      }
      if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3d0,local_3d0);
      }
      if (local_258 == '\x01') {
        llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_2c8);
        local_258 = '\0';
      }
      if (local_3c8 != 0) {
        std::terminate();
      }
      if (local_3c0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_3c0.data_ + 8))();
      }
    }
    else {
      testing::Message::Message(&local_3d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_2c8,(internal *)&local_3b8.character,
                 (AssertionResult *)"loadingResult","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x1b0,local_2c8.cString);
      testing::internal::AssertHelper::operator=(&local_3c0,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_3c0);
      if ((anon_union_80_2_ecfed234_for_valueData *)local_2c8.twine != &local_2b8) {
        operator_delete(local_2c8.twine,(ulong)(local_2b8.asOutputInfo.device + 1));
      }
      if ((long *)CONCAT71(local_3d8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_3d8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_3d8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_3d8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0[0].twine !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3b0[0].character,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_3b0[0].twine);
      }
    }
    llbuild::buildsystem::BuildSystem::~BuildSystem(&local_400);
    local_348.twine = (Twine *)&PTR__MockBuildSystemDelegate_002554b0;
    llbuild::basic::ExecutionQueueDelegate::~ExecutionQueueDelegate(local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_318);
    llbuild::buildsystem::BuildSystemDelegate::~BuildSystemDelegate
              ((BuildSystemDelegate *)&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388.twine != &local_378) {
      operator_delete(local_388.twine,local_378._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250[0]._M_dataplus._M_p != &local_250[0].field_2) {
      free(local_250[0]._M_dataplus._M_p);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    llbuild::TmpDir::~TmpDir(&local_140);
    return;
  }
  __assert_fail("!ec",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                ,0x198,
                "virtual void (anonymous namespace)::BuildSystemTaskTests_doesNotProcessDependenciesAfterCancellation_Test::TestBody()"
               );
}

Assistant:

TEST(BuildSystemTaskTests, doesNotProcessDependenciesAfterCancellation) {
  TmpDir tempDir(__func__);

  std::string outputFile = tempDir.str() + "/output.txt";
  for (auto& c : outputFile) {
    if (c == '\\')
      c = '/';
  }

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << "client:\n"
"  name: mock\n"
"\n"
"commands:\n"
"  WAIT:\n"
"    tool: shell\n"
"    deps: \"/tmp/deps.info\"\n"
"    deps-style: dependency-info\n"
"    inputs: [\"<cleanup>\"]\n";

    os << "    outputs: [\"" << outputFile << "\"]\n";
    os << "    description: \"WAIT\"\n"
"    args:\n";

    os << "      touch " << outputFile << "\n";
    os << "      sleep 9999\n";
  }

  auto keyToBuild = BuildKey::makeCommand("WAIT");
  MockBuildSystemDelegate delegate;
  BuildSystem system(delegate, basic::createLocalFileSystem());
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);

  std::unique_ptr<llbuild::basic::FileSystem> fs = llbuild::basic::createLocalFileSystem();
  std::thread cancelThread([&] {
    // Busy wait until `outputFile` appears which indicates that `yes` is
    // running.
    time_t start = ::time(NULL);
    while (fs->getFileInfo(outputFile).isMissing()) {
      if (::time(NULL) > start + 5) {
        // We can't fail gracefully because the `LaneBasedExecutionQueue` will
        // always wait for spawned processes to exit
        abort();
      }
    }

    system.cancel();
  });

  auto result = system.build(keyToBuild);

  cancelThread.join();
  // This is what we are testing for, if dependencies were processed, an error would occur during the build
  ASSERT_EQ(delegate.getMessages().size(), 0U);
}